

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmSccEa<(moira::Instr)112,(moira::Mode)8,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  Ea<(moira::Mode)8,_(moira::Size)2> src;
  Ea<(moira::Mode)8,_(moira::Size)2> local_34;
  
  local_34.reg = op & 7;
  local_34.pc = *addr;
  *addr = local_34.pc + 2;
  local_34.ext1 = (*this->_vptr_Moira[5])();
  local_34.ext1 = local_34.ext1 & 0xffff;
  uVar6 = local_34.ext1 << 0x10;
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[5])(this);
  local_34.ext1 = uVar4 & 0xffff | uVar6;
  pcVar5 = "spl";
  if (str->upper != false) {
    pcVar5 = "SPL";
  }
  cVar1 = *pcVar5;
  while (cVar1 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar1;
    cVar1 = *pcVar5;
  }
  iVar2 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar2) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,&local_34);
  return;
}

Assistant:

void
Moira::dasmSccEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << src;
}